

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

void uv__server_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  uint fd;
  int iVar1;
  
  if ((events & 1) == 0) {
    __assert_fail("events & POLLIN",
                  "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/stream.c"
                  ,0x202,"void uv__server_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (w[1].events == 0xffffffff) {
    if (((ulong)w[-1].pending_queue.next & 1) != 0) {
      __assert_fail("!(stream->flags & UV_HANDLE_CLOSING)",
                    "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/stream.c"
                    ,0x204,"void uv__server_io(uv_loop_t *, uv__io_t *, unsigned int)");
    }
    iVar1 = w->fd;
    fd = uv__accept(iVar1);
    if ((fd & 0xfffffffe) == 0xffffffe8) {
      if (loop->emfile_fd == -1) {
        fd = 0xffffffe8;
      }
      else {
        uv__close(loop->emfile_fd);
        loop->emfile_fd = -1;
        do {
          fd = uv__accept(iVar1);
          if (-1 < (int)fd) {
            uv__close(fd);
          }
        } while (fd == 0xfffffffc || -1 < (int)fd);
        iVar1 = uv__open_cloexec("/",0);
        if (-1 < iVar1) {
          loop->emfile_fd = iVar1;
        }
      }
    }
    if (-1 < (int)fd) {
      w[1].events = fd;
      (*(code *)w[1].watcher_queue.prev)(&w[-3].watcher_queue.prev,0);
      if (w[1].events != 0xffffffff) {
        uv__io_stop(loop,w,1);
        return;
      }
    }
    return;
  }
  __assert_fail("stream->accepted_fd == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/stream.c"
                ,0x203,"void uv__server_io(uv_loop_t *, uv__io_t *, unsigned int)");
}

Assistant:

void uv__server_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_stream_t* stream;
  int err;
  int fd;

  stream = container_of(w, uv_stream_t, io_watcher);
  assert(events & POLLIN);
  assert(stream->accepted_fd == -1);
  assert(!(stream->flags & UV_HANDLE_CLOSING));

  fd = uv__stream_fd(stream);
  err = uv__accept(fd);

  if (err == UV_EMFILE || err == UV_ENFILE)
    err = uv__emfile_trick(loop, fd);  /* Shed load. */

  if (err < 0)
    return;

  stream->accepted_fd = err;
  stream->connection_cb(stream, 0);

  if (stream->accepted_fd != -1)
    /* The user hasn't yet accepted called uv_accept() */
    uv__io_stop(loop, &stream->io_watcher, POLLIN);
}